

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_get_name(coda_type *type,char **name)

{
  char *pcVar1;
  undefined8 uVar2;
  
  if (type == (coda_type *)0x0) {
    pcVar1 = "read_type argument is NULL (%s:%u)";
    uVar2 = 0xbb5;
  }
  else {
    if (name != (char **)0x0) {
      *name = type->name;
      return 0;
    }
    pcVar1 = "real_name argument is NULL (%s:%u)";
    uVar2 = 0xbba;
  }
  coda_set_error(-100,pcVar1 + 5,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar2);
  return -1;
}

Assistant:

LIBCODA_API int coda_type_get_name(const coda_type *type, const char **name)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (name == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "name argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *name = type->name;
    return 0;
}